

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O2

void __thiscall
CCIT<UFPC>::PerformLabelingMem
          (CCIT<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  Mat1b *pMVar7;
  long lVar8;
  long lVar9;
  pointer piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  pointer puVar18;
  long lVar19;
  void *__child_stack;
  int iVar20;
  uint uVar21;
  pointer puVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  void *__arg;
  pointer puVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  bool bVar35;
  double dVar36;
  uint local_338;
  long local_318;
  long local_2e0;
  long local_2d0;
  allocator_type local_2b9;
  long local_2b8;
  pointer local_2b0;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar3 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar3;
  local_f8.width = (int)((ulong)uVar3 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  uVar3 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::MemAlloc((((int)((ulong)uVar3 >> 0x20) + 1) / 2) * (((int)uVar3 + 1) / 2) + 1);
  UFPC::MemSetup();
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar6 = *(int *)&pMVar7->field_0xc;
  lVar30 = (long)iVar6;
  iVar33 = *(int *)&pMVar7->field_0x8;
  lVar11 = (long)iVar33;
  iVar20 = 0;
  do {
    if (iVar6 <= iVar20) {
      __arg = (void *)0x2;
      local_2d0 = 3;
      local_2e0 = 1;
      local_318 = 0;
      do {
        if (lVar11 <= (long)__arg) {
          uVar21 = UFPC::MemFlatten();
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar21;
          lVar31 = 1;
          uVar32 = 0;
          do {
            piVar10 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar28 = UFPC::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (lVar11 <= (long)uVar32) {
              local_100 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,
                         &local_100,&local_2b9);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                        (accesses,&local_f0);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
              dVar36 = MemMat<unsigned_char>::GetTotalAccesses(&img);
              *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start =
                   (long)(dVar36 - 9.223372036854776e+18) & (long)dVar36 >> 0x3f | (long)dVar36;
              dVar36 = MemMat<int>::GetTotalAccesses(&img_labels);
              (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[1] =
                   (long)dVar36 >> 0x3f & (long)(dVar36 - 9.223372036854776e+18) | (long)dVar36;
              dVar36 = UFPC::MemTotalAccesses();
              __child_stack =
                   (void *)((long)dVar36 >> 0x3f & (long)(dVar36 - 9.223372036854776e+18) |
                           (long)dVar36);
              (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
              cv::Mat_<int>::clone
                        (&local_f0,(__fn *)&img_labels.img_,__child_stack,
                         (int)(long)(dVar36 - 9.223372036854776e+18),__arg);
              cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                  super_Mat,&local_f0.super_Mat);
              cv::Mat::~Mat(&local_f0.super_Mat);
              MemMat<int>::~MemMat(&img_labels);
              MemMat<unsigned_char>::~MemMat(&img);
              return;
            }
            uVar15 = uVar32 | 1;
            local_2b0 = UFPC::mem_P_.vec_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            for (lVar12 = 0; lVar12 < lVar30; lVar12 = lVar12 + 2) {
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar26 = uVar32 * lVar34 + img_labels.accesses_._16_8_;
              iVar6 = *(int *)(lVar26 + lVar12 * 4);
              *(int *)(lVar26 + lVar12 * 4) = iVar6 + 1;
              lVar24 = *(long *)img_labels.img_._72_8_;
              lVar16 = uVar32 * lVar24 + img_labels.img_._16_8_;
              lVar19 = (long)*(int *)(lVar16 + lVar12 * 4);
              if (lVar19 < 1) {
                *(int *)(lVar26 + lVar12 * 4) = iVar6 + 2;
                *(undefined4 *)(lVar16 + lVar12 * 4) = 0;
                if (lVar12 + 1 < lVar30) {
                  piVar2 = (int *)(lVar26 + 4 + lVar12 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)(lVar16 + 4 + lVar12 * 4) = 0;
                  if ((long)uVar15 < lVar11) {
                    lVar34 = lVar34 * lVar31 + img_labels.accesses_._16_8_;
                    piVar2 = (int *)(lVar34 + lVar12 * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar24 = lVar24 * lVar31 + img_labels.img_._16_8_;
                    *(undefined4 *)(lVar24 + lVar12 * 4) = 0;
                    piVar2 = (int *)(lVar34 + 4 + lVar12 * 4);
                    *piVar2 = *piVar2 + 1;
                    *(undefined4 *)(lVar24 + 4 + lVar12 * 4) = 0;
                  }
                }
                else if ((long)uVar15 < lVar11) {
                  piVar2 = (int *)(lVar34 * lVar31 + img_labels.accesses_._16_8_ + lVar12 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar34 = lVar24 * lVar31 + img_labels.img_._16_8_;
LAB_001bc3e3:
                  *(undefined4 *)(lVar34 + lVar12 * 4) = 0;
                }
              }
              else {
                piVar10[lVar19] = piVar10[lVar19] + 1;
                uVar21 = puVar28[lVar19];
                __arg = (void *)(ulong)uVar21;
                lVar19 = *(long *)img.accesses_._72_8_;
                lVar14 = uVar32 * lVar19 + img.accesses_._16_8_;
                piVar2 = (int *)(lVar14 + lVar12 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)img.img_._72_8_;
                lVar29 = uVar32 * lVar13 + img.img_._16_8_;
                uVar23 = uVar21;
                if (*(char *)(lVar12 + lVar29) == '\0') {
                  uVar23 = 0;
                }
                piVar2 = (int *)(lVar26 + lVar12 * 4);
                *piVar2 = *piVar2 + 1;
                *(uint *)(lVar16 + lVar12 * 4) = uVar23;
                if (lVar12 + 1 < lVar30) {
                  piVar2 = (int *)(lVar14 + 4 + lVar12 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar23 = uVar21;
                  if (*(char *)(lVar12 + 1 + lVar29) == '\0') {
                    uVar23 = 0;
                  }
                  piVar2 = (int *)(lVar26 + 4 + lVar12 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(lVar16 + 4 + lVar12 * 4) = uVar23;
                  if ((long)uVar15 < lVar11) {
                    piVar2 = (int *)(lVar19 * lVar31 + img.accesses_._16_8_ + lVar12 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar23 = uVar21;
                    if (*(char *)(lVar12 + lVar13 * lVar31 + img.img_._16_8_) == '\0') {
                      lVar34 = *(long *)img_labels.accesses_._72_8_;
                      uVar23 = 0;
                    }
                    piVar2 = (int *)(lVar34 * lVar31 + img_labels.accesses_._16_8_ + lVar12 * 4);
                    *piVar2 = *piVar2 + 1;
                    *(uint *)(*(long *)img_labels.img_._72_8_ * lVar31 + img_labels.img_._16_8_ +
                             lVar12 * 4) = uVar23;
                    piVar2 = (int *)(*(long *)img.accesses_._72_8_ * lVar31 +
                                     img.accesses_._16_8_ + 4 + lVar12 * 4);
                    *piVar2 = *piVar2 + 1;
                    if (*(char *)(lVar12 + *(long *)img.img_._72_8_ * lVar31 + img.img_._16_8_ + 1)
                        == '\0') {
                      piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar31 +
                                       img_labels.accesses_._16_8_ + 4 + lVar12 * 4);
                      *piVar2 = *piVar2 + 1;
                      *(undefined4 *)
                       (*(long *)img_labels.img_._72_8_ * lVar31 + img_labels.img_._16_8_ + 4 +
                       lVar12 * 4) = 0;
                    }
                    else {
                      piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar31 +
                                       img_labels.accesses_._16_8_ + 4 + lVar12 * 4);
                      *piVar2 = *piVar2 + 1;
                      *(uint *)(*(long *)img_labels.img_._72_8_ * lVar31 +
                                img_labels.img_._16_8_ + 4 + lVar12 * 4) = uVar21;
                    }
                  }
                }
                else if ((long)uVar15 < lVar11) {
                  piVar2 = (int *)(lVar19 * lVar31 + img.accesses_._16_8_ + lVar12 * 4);
                  *piVar2 = *piVar2 + 1;
                  cVar4 = *(char *)(lVar12 + lVar13 * lVar31 + img.img_._16_8_);
                  piVar2 = (int *)(lVar34 * lVar31 + img_labels.accesses_._16_8_ + lVar12 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar34 = lVar24 * lVar31 + img_labels.img_._16_8_;
                  if (cVar4 == '\0') goto LAB_001bc3e3;
                  *(uint *)(lVar34 + lVar12 * 4) = uVar21;
                }
              }
            }
            uVar32 = uVar32 + 2;
            lVar31 = lVar31 + 2;
          } while( true );
        }
        local_2b8 = (long)__arg - 1;
        lVar31 = (long)__arg - 2;
        uVar32 = (ulong)__arg | 1;
        uVar15 = 0;
        while (iVar33 = (int)uVar15, iVar33 < iVar6) {
          lVar12 = *(long *)img.accesses_._72_8_;
          lVar24 = lVar12 * (long)__arg + img.accesses_._16_8_;
          puVar28 = (pointer)(long)iVar33;
          piVar2 = (int *)(lVar24 + (long)puVar28 * 4);
          *piVar2 = *piVar2 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          lVar26 = lVar34 * (long)__arg + img.img_._16_8_;
          uVar21 = iVar33 + 1;
          if (*(char *)((long)puVar28 + lVar26) == '\0') {
            if (((int)uVar21 < iVar6) &&
               (piVar2 = (int *)(lVar24 + 4 + (long)puVar28 * 4), *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + 1 + (long)puVar28) != '\0')) {
              lVar24 = img.accesses_._16_8_ + lVar12 * local_2b8;
              piVar2 = (int *)(lVar24 + 4 + (long)puVar28 * 4);
              *piVar2 = *piVar2 + 1;
              lVar12 = img.img_._16_8_ + lVar34 * local_2b8;
              if (*(char *)((long)puVar28 + lVar12 + 1) == '\0') {
                piVar2 = (int *)(lVar24 + (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar12 + (long)puVar28) != '\0') {
                  lVar34 = *(long *)img_labels.accesses_._72_8_;
                  lVar16 = lVar34 * lVar31 + img_labels.accesses_._16_8_;
                  piVar2 = (int *)(lVar16 + (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar26 = *(long *)img_labels.img_._72_8_;
                  lVar19 = lVar26 * lVar31 + img_labels.img_._16_8_;
                  local_338 = *(uint *)(lVar19 + (long)puVar28 * 4);
                  piVar2 = (int *)(lVar34 * (long)__arg + img_labels.accesses_._16_8_ +
                                  (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(lVar26 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                       local_338;
                  bVar35 = true;
                  if ((iVar33 + 2 < iVar6) &&
                     (piVar2 = (int *)(lVar24 + 8 + (long)puVar28 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar12 + 2 + (long)puVar28) != '\0')) {
                    piVar2 = (int *)(lVar16 + 8 + (long)puVar28 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = *(uint *)(lVar19 + 8 + (long)puVar28 * 4);
                    goto LAB_001bb45c;
                  }
                  goto LAB_001bb668;
                }
                if ((iVar33 + 2 < iVar6) &&
                   (piVar2 = (int *)(lVar24 + 8 + (long)puVar28 * 4), *piVar2 = *piVar2 + 1,
                   *(char *)(lVar12 + 2 + (long)puVar28) != '\0')) {
                  lVar12 = *(long *)img_labels.accesses_._72_8_;
                  piVar2 = (int *)(lVar12 * lVar31 + img_labels.accesses_._16_8_ + 8 +
                                  (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  local_338 = *(uint *)(lVar34 * lVar31 + img_labels.img_._16_8_ + 8 +
                                       (long)puVar28 * 4);
                  goto LAB_001baedb;
                }
LAB_001bb603:
                local_338 = UFPC::MemNewLabel();
                lVar12 = *(long *)img_labels.accesses_._72_8_;
LAB_001bb639:
                piVar2 = (int *)(lVar12 * (long)__arg + img_labels.accesses_._16_8_ +
                                (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * (long)__arg + img_labels.img_._16_8_ +
                         (long)puVar28 * 4) = local_338;
              }
              else {
                lVar12 = *(long *)img_labels.accesses_._72_8_;
                piVar2 = (int *)(lVar12 * lVar31 + img_labels.accesses_._16_8_ + (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                local_338 = *(uint *)(lVar34 * lVar31 + img_labels.img_._16_8_ + (long)puVar28 * 4);
LAB_001baedb:
                piVar2 = (int *)(lVar12 * (long)__arg + img_labels.accesses_._16_8_ +
                                (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                *(uint *)(lVar34 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                     local_338;
              }
              bVar35 = true;
            }
            else {
              if ((long)uVar32 < lVar11) {
                lVar24 = img.accesses_._16_8_ + lVar12 * uVar32;
                piVar2 = (int *)(lVar24 + (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                lVar12 = img.img_._16_8_ + lVar34 * uVar32;
                if (*(char *)((long)puVar28 + lVar12) != '\0') {
                  local_338 = UFPC::MemNewLabel();
                  piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * (long)__arg +
                                   img_labels.accesses_._16_8_ + (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(*(long *)img_labels.img_._72_8_ * (long)__arg + img_labels.img_._16_8_ +
                           (long)puVar28 * 4) = local_338;
                  if ((int)uVar21 < iVar6) {
                    piVar2 = (int *)(*(long *)img.accesses_._72_8_ * uVar32 + img.accesses_._16_8_ +
                                     4 + (long)puVar28 * 4);
                    *piVar2 = *piVar2 + 1;
                    bVar35 = true;
                    if (*(char *)((long)puVar28 +
                                 *(long *)img.img_._72_8_ * uVar32 + img.img_._16_8_ + 1) != '\0')
                    goto LAB_001bb668;
                  }
                  goto LAB_001bb293;
                }
                if (((int)uVar21 < iVar6) &&
                   (piVar2 = (int *)(lVar24 + 4 + (long)puVar28 * 4), *piVar2 = *piVar2 + 1,
                   *(char *)(lVar12 + 1 + (long)puVar28) != '\0')) goto LAB_001bb603;
              }
              bVar35 = false;
            }
          }
          else {
            if ((int)uVar21 < iVar6) {
              piVar2 = (int *)(lVar24 + 4 + (long)puVar28 * 4);
              *piVar2 = *piVar2 + 1;
              if (*(char *)(lVar26 + 1 + (long)puVar28) != '\0') {
                lVar24 = img.accesses_._16_8_ + lVar12 * local_2b8;
                piVar2 = (int *)(lVar24 + (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                lVar12 = img.img_._16_8_ + lVar34 * local_2b8;
                if (*(char *)((long)puVar28 + lVar12) == '\0') {
                  piVar2 = (int *)(lVar24 + 4 + (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  if (*(char *)(lVar12 + 1 + (long)puVar28) == '\0') {
                    if ((iVar33 < 2) ||
                       (piVar2 = (int *)(lVar24 + (ulong)(iVar33 - 1) * 4), *piVar2 = *piVar2 + 1,
                       *(char *)(lVar12 + (ulong)(iVar33 - 1)) == '\0')) {
                      if ((iVar33 + 2 < iVar6) &&
                         (piVar2 = (int *)(lVar24 + 8 + (long)puVar28 * 4), *piVar2 = *piVar2 + 1,
                         *(char *)(lVar12 + 2 + (long)puVar28) != '\0')) {
                        lVar12 = *(long *)img_labels.accesses_._72_8_;
                        piVar2 = (int *)(lVar12 * lVar31 + img_labels.accesses_._16_8_ + 8 +
                                        (long)puVar28 * 4);
                        *piVar2 = *piVar2 + 1;
                        lVar34 = *(long *)img_labels.img_._72_8_;
                        local_338 = *(uint *)(lVar34 * lVar31 + img_labels.img_._16_8_ + 8 +
                                             (long)puVar28 * 4);
                        goto LAB_001baedb;
                      }
                      local_338 = UFPC::MemNewLabel();
                      lVar12 = *(long *)img_labels.accesses_._72_8_;
                      goto LAB_001bb639;
                    }
                    lVar34 = *(long *)img_labels.accesses_._72_8_;
                    lVar16 = lVar34 * lVar31 + img_labels.accesses_._16_8_;
                    piVar2 = (int *)(lVar16 + (ulong)(iVar33 - 2) * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar26 = *(long *)img_labels.img_._72_8_;
                    lVar19 = lVar26 * lVar31 + img_labels.img_._16_8_;
                    local_338 = *(uint *)(lVar19 + (ulong)(iVar33 - 2) * 4);
                    piVar2 = (int *)(lVar34 * (long)__arg + img_labels.accesses_._16_8_ +
                                    (long)puVar28 * 4);
                    *piVar2 = *piVar2 + 1;
                    *(uint *)(lVar26 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                         local_338;
                    bVar35 = true;
                    if ((iVar33 + 2 < iVar6) &&
                       (piVar2 = (int *)(lVar24 + 8 + uVar15 * 4), *piVar2 = *piVar2 + 1,
                       *(char *)(lVar12 + 2 + uVar15) != '\0')) {
                      piVar2 = (int *)(lVar16 + 8 + uVar15 * 4);
                      *piVar2 = *piVar2 + 1;
                      UFPC::MemMerge(local_338,*(uint *)(lVar19 + 8 + uVar15 * 4));
                    }
                  }
                  else {
                    lVar12 = *(long *)img_labels.accesses_._72_8_;
                    piVar2 = (int *)(lVar12 * lVar31 + img_labels.accesses_._16_8_ +
                                    (long)puVar28 * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_;
                    local_338 = *(uint *)(lVar34 * lVar31 + img_labels.img_._16_8_ +
                                         (long)puVar28 * 4);
                    piVar2 = (int *)(lVar12 * (long)__arg + img_labels.accesses_._16_8_ +
                                    (long)puVar28 * 4);
                    *piVar2 = *piVar2 + 1;
                    *(uint *)(lVar34 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                         local_338;
                    bVar35 = true;
                    if ((1 < iVar33) &&
                       (piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 +
                                         img.accesses_._16_8_ + (ulong)(iVar33 - 1) * 4),
                       *piVar2 = *piVar2 + 1,
                       *(char *)((ulong)(iVar33 - 1) +
                                *(long *)img.img_._72_8_ * local_2b8 + img.img_._16_8_) != '\0')) {
                      piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar31 +
                                       img_labels.accesses_._16_8_ + (ulong)(iVar33 - 2) * 4);
                      *piVar2 = *piVar2 + 1;
                      uVar21 = *(uint *)(*(long *)img_labels.img_._72_8_ * lVar31 +
                                         img_labels.img_._16_8_ + (ulong)(iVar33 - 2) * 4);
                      goto LAB_001bb45c;
                    }
                  }
                }
                else {
                  lVar12 = *(long *)img_labels.accesses_._72_8_;
                  piVar2 = (int *)(lVar12 * lVar31 + img_labels.accesses_._16_8_ + (long)puVar28 * 4
                                  );
                  *piVar2 = *piVar2 + 1;
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  local_338 = *(uint *)(lVar34 * lVar31 + img_labels.img_._16_8_ + (long)puVar28 * 4
                                       );
                  piVar2 = (int *)(lVar12 * (long)__arg + img_labels.accesses_._16_8_ +
                                  (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(lVar34 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                       local_338;
                  piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 + img.accesses_._16_8_
                                   + 4 + (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar12 = *(long *)img.img_._72_8_ * local_2b8 + img.img_._16_8_;
                  bVar35 = true;
                  if (((*(char *)((long)puVar28 + lVar12 + 1) == '\0') && (iVar33 + 2 < iVar6)) &&
                     (piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 +
                                       img.accesses_._16_8_ + 8 + (long)puVar28 * 4),
                     *piVar2 = *piVar2 + 1, *(char *)(lVar12 + 2 + (long)puVar28) != '\0')) {
                    piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar31 +
                                     img_labels.accesses_._16_8_ + 8 + (long)puVar28 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = *(uint *)(*(long *)img_labels.img_._72_8_ * lVar31 +
                                       img_labels.img_._16_8_ + 8 + (long)puVar28 * 4);
LAB_001bb45c:
                    bVar35 = true;
                    UFPC::MemMerge(local_338,uVar21);
                  }
                }
                goto LAB_001bb668;
              }
              lVar34 = *(long *)img.img_._72_8_;
            }
            piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 + img.accesses_._16_8_ +
                            (long)puVar28 * 4);
            *piVar2 = *piVar2 + 1;
            lVar12 = lVar34 * local_2b8 + img.img_._16_8_;
            if (*(char *)((long)puVar28 + lVar12) == '\0') {
              if ((iVar33 < 2) ||
                 (piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 + img.accesses_._16_8_
                                  + (ulong)(iVar33 - 1) * 4), *piVar2 = *piVar2 + 1,
                 *(char *)(lVar12 + (ulong)(iVar33 - 1)) == '\0')) {
                if ((iVar6 <= (int)uVar21) ||
                   (piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 +
                                     img.accesses_._16_8_ + 4 + (long)puVar28 * 4),
                   *piVar2 = *piVar2 + 1, *(char *)(lVar12 + 1 + (long)puVar28) == '\0')) {
                  local_338 = UFPC::MemNewLabel();
                  piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * (long)__arg +
                                   img_labels.accesses_._16_8_ + (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar12 = *(long *)img_labels.img_._72_8_;
                  goto LAB_001bb238;
                }
                lVar12 = *(long *)img_labels.accesses_._72_8_;
                piVar2 = (int *)(lVar12 * lVar31 + img_labels.accesses_._16_8_ + (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                local_338 = *(uint *)(lVar34 * lVar31 + img_labels.img_._16_8_ + (long)puVar28 * 4);
                piVar2 = (int *)(lVar12 * (long)__arg + img_labels.accesses_._16_8_ +
                                (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                *(uint *)(lVar34 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                     local_338;
              }
              else {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar2 = (int *)(lVar34 * lVar31 + img_labels.accesses_._16_8_ +
                                (ulong)(iVar33 - 2) * 4);
                *piVar2 = *piVar2 + 1;
                lVar24 = *(long *)img_labels.img_._72_8_;
                local_338 = *(uint *)(lVar24 * lVar31 + img_labels.img_._16_8_ +
                                     (ulong)(iVar33 - 2) * 4);
                piVar2 = (int *)(lVar34 * (long)__arg + img_labels.accesses_._16_8_ +
                                (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                *(uint *)(lVar24 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                     local_338;
                if (iVar6 <= (int)uVar21) {
                  bVar35 = false;
                  goto LAB_001bb668;
                }
                piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2b8 + img.accesses_._16_8_ +
                                (ulong)uVar21 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar12 + (ulong)uVar21) != '\0') {
                  piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar31 +
                                   img_labels.accesses_._16_8_ + (long)puVar28 * 4);
                  *piVar2 = *piVar2 + 1;
                  UFPC::MemMerge(local_338,
                                 *(uint *)(*(long *)img_labels.img_._72_8_ * lVar31 +
                                           img_labels.img_._16_8_ + (long)puVar28 * 4));
                }
              }
LAB_001bb24a:
              if ((long)uVar32 < lVar11) {
                piVar2 = (int *)(*(long *)img.accesses_._72_8_ * uVar32 + img.accesses_._16_8_ + 4 +
                                (long)puVar28 * 4);
                *piVar2 = *piVar2 + 1;
                bVar35 = *(char *)((long)puVar28 +
                                  *(long *)img.img_._72_8_ * uVar32 + img.img_._16_8_ + 1) != '\0';
                goto LAB_001bb668;
              }
            }
            else {
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              piVar2 = (int *)(lVar34 * lVar31 + img_labels.accesses_._16_8_ + (long)puVar28 * 4);
              *piVar2 = *piVar2 + 1;
              lVar12 = *(long *)img_labels.img_._72_8_;
              local_338 = *(uint *)(lVar12 * lVar31 + img_labels.img_._16_8_ + (long)puVar28 * 4);
              piVar2 = (int *)(lVar34 * (long)__arg + img_labels.accesses_._16_8_ +
                              (long)puVar28 * 4);
              *piVar2 = *piVar2 + 1;
LAB_001bb238:
              *(uint *)(lVar12 * (long)__arg + img_labels.img_._16_8_ + (long)puVar28 * 4) =
                   local_338;
              if ((int)uVar21 < iVar6) goto LAB_001bb24a;
            }
LAB_001bb293:
            bVar35 = false;
          }
LAB_001bb668:
          lVar12 = (long)puVar28 * 4;
          puVar22 = puVar28;
          for (lVar34 = 0; (bVar35 && ((long)puVar28 + lVar34 + 2 < lVar30)); lVar34 = lVar34 + 2) {
            lVar26 = *(long *)img.accesses_._72_8_;
            lVar13 = img.accesses_._16_8_ + lVar12;
            lVar29 = (long)__arg * lVar26 + lVar13;
            piVar2 = (int *)(lVar29 + 8 + lVar34 * 4);
            *piVar2 = *piVar2 + 1;
            puVar22 = (pointer)((long)puVar22 + 2);
            lVar16 = *(long *)img.img_._72_8_;
            lVar19 = (long)__arg * lVar16 + img.img_._16_8_;
            lVar24 = (long)puVar28 + lVar34 + 3;
            if (*(char *)((long)puVar28 + lVar34 + 2 + lVar19) == '\0') {
              if ((lVar24 < lVar30) &&
                 (piVar2 = (int *)(lVar29 + 0xc + lVar34 * 4), *piVar2 = *piVar2 + 1,
                 *(char *)((long)puVar28 + lVar34 + 3 + lVar19) != '\0')) {
                if (((long)uVar32 < lVar11) &&
                   (piVar2 = (int *)(local_2d0 * lVar26 + lVar13 + 8 + lVar34 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)((long)puVar28 + lVar34 + 2 + local_2d0 * lVar16 + img.img_._16_8_) !=
                   '\0')) {
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  lVar14 = img_labels.accesses_._16_8_ + lVar12;
                  piVar2 = (int *)((long)__arg * lVar24 + lVar14 + 8 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar19 = *(long *)img_labels.img_._72_8_;
                  lVar29 = img_labels.img_._16_8_ + lVar12;
                  *(uint *)((long)__arg * lVar19 + lVar29 + 8 + lVar34 * 4) = local_338;
                  lVar13 = lVar13 + lVar26 * local_2e0;
                  piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar26 = lVar16 * local_2e0 + img.img_._16_8_;
                  if (*(char *)((long)puVar28 + lVar34 + 3 + lVar26) == '\0') {
                    piVar2 = (int *)(lVar13 + 8 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    if (*(char *)((long)puVar28 + lVar34 + 2 + lVar26) != '\0') {
                      if ((lVar30 <= (long)puVar28 + lVar34 + 4) ||
                         (piVar2 = (int *)(lVar13 + 0x10 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                         *(char *)((long)puVar28 + lVar34 + 4 + lVar26) == '\0')) goto LAB_001bb9a4;
                      lVar14 = lVar14 + lVar24 * local_318;
                      piVar2 = (int *)(lVar14 + 8 + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      lVar29 = lVar29 + lVar19 * local_318;
                      uVar21 = *(uint *)(lVar29 + 8 + lVar34 * 4);
                      piVar2 = (int *)(lVar14 + 0x10 + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      uVar21 = UFPC::MemMerge(uVar21,*(uint *)(lVar29 + 0x10 + lVar34 * 4));
                      goto LAB_001bb9bf;
                    }
                  }
                  else {
LAB_001bb9a4:
                    piVar2 = (int *)(lVar14 + lVar24 * local_318 + 8 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = *(uint *)(lVar29 + lVar19 * local_318 + 8 + lVar34 * 4);
LAB_001bb9bf:
                    UFPC::MemMerge(local_338,uVar21);
                  }
                  bVar35 = true;
                  if (lVar30 <= (long)puVar28 + lVar34 + 4) goto LAB_001bbd4a;
                  piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2e0 + img.accesses_._16_8_
                                   + lVar12 + 0x10 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  if (*(char *)((long)puVar28 +
                               lVar34 + 4 + *(long *)img.img_._72_8_ * local_2e0 + img.img_._16_8_)
                      != '\0') {
                    piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * local_318 +
                                     img_labels.accesses_._16_8_ + lVar12 + 0x10 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    UFPC::MemMerge(local_338,
                                   *(uint *)(*(long *)img_labels.img_._72_8_ * local_318 +
                                             img_labels.img_._16_8_ + lVar12 + 0x10 + lVar34 * 4));
                  }
                }
                else {
                  lVar13 = lVar13 + lVar26 * local_2e0;
                  piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar24 = lVar16 * local_2e0 + img.img_._16_8_;
                  if (*(char *)((long)puVar28 + lVar34 + 3 + lVar24) == '\0') {
                    piVar2 = (int *)(lVar13 + 8 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    if (*(char *)((long)puVar28 + lVar34 + 2 + lVar24) != '\0') {
                      lVar26 = *(long *)img_labels.accesses_._72_8_;
                      lVar19 = local_318 * lVar26 + img_labels.accesses_._16_8_ + lVar12;
                      piVar2 = (int *)(lVar19 + 8 + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      lVar16 = *(long *)img_labels.img_._72_8_;
                      lVar29 = local_318 * lVar16 + img_labels.img_._16_8_ + lVar12;
                      local_338 = *(uint *)(lVar29 + 8 + lVar34 * 4);
                      piVar2 = (int *)(lVar26 * (long)__arg + img_labels.accesses_._16_8_ + lVar12 +
                                       8 + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      *(uint *)(lVar16 * (long)__arg + img_labels.img_._16_8_ + lVar12 + 8 +
                               lVar34 * 4) = local_338;
                      if (((long)puVar28 + lVar34 + 4 < lVar30) &&
                         (piVar2 = (int *)(lVar13 + 0x10 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                         *(char *)((long)puVar28 + lVar34 + 4 + lVar24) != '\0')) {
                        piVar2 = (int *)(lVar19 + 0x10 + lVar34 * 4);
                        *piVar2 = *piVar2 + 1;
                        uVar21 = *(uint *)(lVar29 + 0x10 + lVar34 * 4);
                        goto LAB_001bbf0d;
                      }
                      goto LAB_001bbd4a;
                    }
                    if ((lVar30 <= (long)puVar28 + lVar34 + 4) ||
                       (piVar2 = (int *)(lVar13 + 0x10 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                       *(char *)((long)puVar28 + lVar34 + 4 + lVar24) == '\0')) {
                      local_338 = UFPC::MemNewLabel();
                      lVar24 = *(long *)img_labels.accesses_._72_8_;
                      goto LAB_001bc00e;
                    }
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar2 = (int *)(local_318 * lVar24 + img_labels.accesses_._16_8_ + lVar12 +
                                     0x10 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar26 = *(long *)img_labels.img_._72_8_;
                    local_338 = *(uint *)(local_318 * lVar26 + img_labels.img_._16_8_ + lVar12 +
                                          0x10 + lVar34 * 4);
                  }
                  else {
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar2 = (int *)(local_318 * lVar24 + img_labels.accesses_._16_8_ + lVar12 + 8 +
                                    lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar26 = *(long *)img_labels.img_._72_8_;
                    local_338 = *(uint *)(local_318 * lVar26 + img_labels.img_._16_8_ + lVar12 + 8 +
                                         lVar34 * 4);
                  }
                  piVar2 = (int *)(lVar24 * (long)__arg + img_labels.accesses_._16_8_ + lVar12 + 8 +
                                  lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(lVar26 * (long)__arg + img_labels.img_._16_8_ + lVar12 + 8 + lVar34 * 4)
                       = local_338;
LAB_001bc042:
                  bVar35 = true;
                }
              }
              else {
                if ((long)uVar32 < lVar11) {
                  lVar13 = lVar13 + lVar26 * local_2d0;
                  piVar2 = (int *)(lVar13 + 8 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar26 = (long)puVar28 + lVar16 * local_2d0 + img.img_._16_8_;
                  if (*(char *)(lVar34 + 2 + lVar26) == '\0') {
                    if ((lVar24 < lVar30) &&
                       (piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4), *piVar2 = *piVar2 + 1,
                       *(char *)(lVar34 + 3 + lVar26) != '\0')) {
                      local_338 = UFPC::MemNewLabel();
                      lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_001bc00e:
                      piVar2 = (int *)(lVar24 * (long)__arg + img_labels.accesses_._16_8_ + lVar12 +
                                       8 + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      *(uint *)(*(long *)img_labels.img_._72_8_ * (long)__arg +
                                img_labels.img_._16_8_ + lVar12 + 8 + lVar34 * 4) = local_338;
                      goto LAB_001bc042;
                    }
                  }
                  else {
                    piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * (long)__arg +
                                     img_labels.accesses_._16_8_ + lVar12 + 8 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    *(uint *)(*(long *)img_labels.img_._72_8_ * (long)__arg + img_labels.img_._16_8_
                              + lVar12 + 8 + lVar34 * 4) = local_338;
                    if (lVar24 < lVar30) {
                      piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      goto LAB_001bb8cd;
                    }
                  }
                  goto LAB_001bbd85;
                }
                bVar35 = false;
              }
            }
            else {
              local_2b0 = (pointer)((long)puVar28 + lVar34);
              lVar8 = *(long *)img_labels.accesses_._72_8_;
              lVar14 = img_labels.accesses_._16_8_ + lVar12;
              lVar17 = (long)__arg * lVar8 + lVar14;
              piVar2 = (int *)(lVar17 + 8 + lVar34 * 4);
              *piVar2 = *piVar2 + 1;
              lVar9 = *(long *)img_labels.img_._72_8_;
              lVar25 = lVar12 + img_labels.img_._16_8_;
              lVar27 = (long)__arg * lVar9 + lVar25;
              *(uint *)(lVar27 + 8 + lVar34 * 4) = local_338;
              if ((lVar30 <= lVar24) ||
                 (piVar2 = (int *)(lVar29 + 0xc + lVar34 * 4), *piVar2 = *piVar2 + 1,
                 *(char *)((long)puVar28 + lVar34 + 3 + lVar19) == '\0')) {
                piVar2 = (int *)(lVar17 + 8 + lVar34 * 4);
                *piVar2 = *piVar2 + 1;
                *(uint *)(lVar27 + 8 + lVar34 * 4) = local_338;
                lVar13 = lVar13 + lVar26 * local_2e0;
                piVar2 = (int *)(lVar13 + 8 + lVar34 * 4);
                *piVar2 = *piVar2 + 1;
                lVar26 = lVar16 * local_2e0 + img.img_._16_8_;
                puVar18 = puVar22;
                if (*(char *)((long)puVar28 + lVar34 + 2 + lVar26) == '\0') {
                  if (((long)local_2b0 < 0) ||
                     (piVar2 = (int *)(lVar13 + 4 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)((long)puVar28 + lVar34 + 1 + lVar26) == '\0')) {
                    if (lVar30 <= lVar24) goto LAB_001bbd85;
                    piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    if (*(char *)((long)puVar28 + lVar34 + 3 + lVar26) != '\0') {
                      piVar2 = (int *)(lVar14 + lVar8 * local_318 + 8 + lVar34 * 4);
                      *piVar2 = *piVar2 + 1;
                      uVar21 = *(uint *)(lVar25 + lVar9 * local_318 + 8 + lVar34 * 4);
                      goto LAB_001bbbe6;
                    }
                  }
                  else {
                    puVar18 = local_2b0;
                    if ((lVar30 <= lVar24) ||
                       (piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4), *piVar2 = *piVar2 + 1,
                       *(char *)((long)puVar28 + lVar34 + 3 + lVar26) == '\0')) goto LAB_001bb83e;
                    lVar14 = lVar14 + lVar8 * local_318;
                    piVar2 = (int *)(lVar14 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar25 = lVar25 + lVar9 * local_318;
                    uVar21 = *(uint *)(lVar25 + lVar34 * 4);
                    piVar2 = (int *)(lVar14 + 8 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = UFPC::MemMerge(uVar21,*(uint *)(lVar25 + 8 + lVar34 * 4));
LAB_001bbbe6:
                    UFPC::MemMerge(local_338,uVar21);
                  }
                }
                else {
LAB_001bb83e:
                  piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar8 * lVar31 + (long)puVar18 * 4)
                  ;
                  *piVar2 = *piVar2 + 1;
                  UFPC::MemMerge(local_338,
                                 *(uint *)(img_labels.img_._16_8_ + lVar9 * lVar31 +
                                          (long)puVar18 * 4));
                  if (lVar30 <= lVar24) goto LAB_001bbd85;
                }
                if ((long)uVar32 < lVar11) {
                  piVar2 = (int *)(*(long *)img.accesses_._72_8_ * local_2d0 + img.accesses_._16_8_
                                   + lVar12 + 0xc + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar26 = *(long *)img.img_._72_8_ * local_2d0 + img.img_._16_8_ + (long)puVar28;
LAB_001bb8cd:
                  bVar35 = true;
                  if (*(char *)(lVar34 + 3 + lVar26) != '\0') goto LAB_001bbd88;
                }
LAB_001bbd85:
                bVar35 = false;
                goto LAB_001bbd88;
              }
              lVar13 = lVar13 + lVar26 * local_2e0;
              piVar2 = (int *)(lVar13 + 8 + lVar34 * 4);
              *piVar2 = *piVar2 + 1;
              lVar24 = lVar16 * local_2e0 + img.img_._16_8_;
              cVar4 = *(char *)((long)puVar28 + lVar34 + 2 + lVar24);
              piVar2 = (int *)(lVar13 + 0xc + lVar34 * 4);
              *piVar2 = *piVar2 + 1;
              cVar5 = *(char *)((long)puVar28 + lVar34 + 3 + lVar24);
              if (cVar4 == '\0') {
                if (cVar5 != '\0') {
                  if (((long)local_2b0 < 0) ||
                     (piVar2 = (int *)(lVar13 + 4 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)((long)puVar28 + lVar34 + 1 + lVar24) == '\0')) goto LAB_001bbd06;
                  lVar14 = lVar14 + lVar8 * local_318;
                  piVar2 = (int *)(lVar14 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar25 = lVar25 + lVar9 * local_318;
                  uVar21 = *(uint *)(lVar25 + lVar34 * 4);
                  piVar2 = (int *)(lVar14 + 8 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar23 = *(uint *)(lVar25 + 8 + lVar34 * 4);
                  goto LAB_001bbcfa;
                }
                if (((long)local_2b0 < 0) ||
                   (piVar2 = (int *)(lVar13 + 4 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                   *(char *)((long)puVar28 + lVar34 + 1 + lVar24) == '\0')) {
                  if (((long)puVar28 + lVar34 + 4 < lVar30) &&
                     (piVar2 = (int *)(lVar13 + 0x10 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)((long)puVar28 + lVar34 + 4 + lVar24) != '\0')) {
                    piVar2 = (int *)(lVar14 + lVar8 * local_318 + 0x10 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = *(uint *)(lVar25 + lVar9 * local_318 + 0x10 + lVar34 * 4);
LAB_001bbf0d:
                    UFPC::MemMerge(local_338,uVar21);
                  }
                }
                else {
                  if (((long)puVar28 + lVar34 + 4 < lVar30) &&
                     (piVar2 = (int *)(lVar13 + 0x10 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)((long)puVar28 + lVar34 + 4 + lVar24) != '\0')) {
                    lVar14 = lVar14 + lVar8 * local_318;
                    piVar2 = (int *)(lVar14 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    lVar25 = lVar25 + lVar9 * local_318;
                    uVar21 = *(uint *)(lVar25 + lVar34 * 4);
                    piVar2 = (int *)(lVar14 + 0x10 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = UFPC::MemMerge(uVar21,*(uint *)(lVar25 + 0x10 + lVar34 * 4));
                  }
                  else {
                    piVar2 = (int *)(lVar14 + lVar8 * local_318 + lVar34 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar21 = *(uint *)(lVar25 + lVar9 * local_318 + lVar34 * 4);
                  }
                  UFPC::MemMerge(local_338,uVar21);
                }
              }
              else {
                if (((cVar5 == '\0') && ((long)puVar28 + lVar34 + 4 < lVar30)) &&
                   (piVar2 = (int *)(lVar13 + 0x10 + lVar34 * 4), *piVar2 = *piVar2 + 1,
                   *(char *)((long)puVar28 + lVar34 + 4 + lVar24) != '\0')) {
                  lVar14 = lVar14 + lVar8 * local_318;
                  piVar2 = (int *)(lVar14 + 8 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar25 = lVar25 + lVar9 * local_318;
                  uVar21 = *(uint *)(lVar25 + 8 + lVar34 * 4);
                  piVar2 = (int *)(lVar14 + 0x10 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar23 = *(uint *)(lVar25 + 0x10 + lVar34 * 4);
LAB_001bbcfa:
                  uVar21 = UFPC::MemMerge(uVar21,uVar23);
                }
                else {
LAB_001bbd06:
                  piVar2 = (int *)(lVar14 + lVar8 * local_318 + 8 + lVar34 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar21 = *(uint *)(lVar25 + lVar9 * local_318 + 8 + lVar34 * 4);
                }
                UFPC::MemMerge(local_338,uVar21);
              }
LAB_001bbd4a:
              bVar35 = true;
            }
LAB_001bbd88:
          }
          uVar15 = (ulong)(iVar33 + (int)lVar34 + 2);
        }
        __arg = (void *)((long)__arg + 2);
        local_318 = local_318 + 2;
        local_2d0 = local_2d0 + 2;
        local_2e0 = local_2e0 + 2;
      } while( true );
    }
    lVar31 = (long)iVar20;
    piVar2 = (int *)(img.accesses_._16_8_ + lVar31 * 4);
    *piVar2 = *piVar2 + 1;
    if (*(char *)(img.img_._16_8_ + lVar31) == '\0') {
      iVar1 = iVar20 + 1;
      if ((iVar1 < iVar6) &&
         (piVar2 = (int *)(img.accesses_._16_8_ + 4 + lVar31 * 4), *piVar2 = *piVar2 + 1,
         *(char *)(img.img_._16_8_ + 1 + lVar31) != '\0')) {
LAB_001ba985:
        local_338 = UFPC::MemNewLabel();
        piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar31 * 4);
        *piVar2 = *piVar2 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar31 * 4) = local_338;
        bVar35 = true;
        goto LAB_001baa3c;
      }
      if (1 < iVar33) {
        lVar12 = *(long *)img.accesses_._72_8_;
        piVar2 = (int *)(img.accesses_._16_8_ + lVar12 + lVar31 * 4);
        *piVar2 = *piVar2 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar31 + img.img_._16_8_ + lVar34) == '\0') {
          if ((iVar1 < iVar6) &&
             (piVar2 = (int *)(img.accesses_._16_8_ + lVar12 + 4 + lVar31 * 4),
             *piVar2 = *piVar2 + 1, *(char *)(img.img_._16_8_ + lVar34 + 1 + lVar31) != '\0'))
          goto LAB_001ba985;
        }
        else {
          local_338 = UFPC::MemNewLabel();
          piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar31 * 4);
          *piVar2 = *piVar2 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar31 * 4) = local_338;
          if (iVar1 < iVar6) {
            piVar2 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 4 + lVar31 * 4);
            *piVar2 = *piVar2 + 1;
            cVar4 = *(char *)(lVar31 + 1 + img.img_._16_8_ + *(long *)img.img_._72_8_);
            goto joined_r0x001baa20;
          }
        }
      }
LAB_001baa3a:
      bVar35 = false;
    }
    else {
      local_338 = UFPC::MemNewLabel();
      piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar31 * 4);
      *piVar2 = *piVar2 + 1;
      *(uint *)(img_labels.img_._16_8_ + lVar31 * 4) = local_338;
      if (iVar6 <= iVar20 + 1) goto LAB_001baa3a;
      piVar2 = (int *)(img.accesses_._16_8_ + 4 + lVar31 * 4);
      *piVar2 = *piVar2 + 1;
      bVar35 = true;
      if (*(char *)(img.img_._16_8_ + 1 + lVar31) == '\0') {
        if (1 < iVar33) {
          piVar2 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 4 + lVar31 * 4);
          *piVar2 = *piVar2 + 1;
          cVar4 = *(char *)(lVar31 + 1 + img.img_._16_8_ + *(long *)img.img_._72_8_);
joined_r0x001baa20:
          bVar35 = true;
          if (cVar4 != '\0') goto LAB_001baa3c;
        }
        goto LAB_001baa3a;
      }
    }
LAB_001baa3c:
    lVar12 = lVar31 * 4;
    for (lVar34 = 0; (bVar35 && (lVar31 + lVar34 + 2 < lVar30)); lVar34 = lVar34 + 2) {
      lVar24 = img.accesses_._16_8_ + lVar12;
      piVar2 = (int *)(lVar24 + 8 + lVar34 * 4);
      *piVar2 = *piVar2 + 1;
      lVar26 = img.img_._16_8_ + lVar31;
      lVar16 = lVar31 + 3 + lVar34;
      if (*(char *)(lVar34 + 2 + lVar26) == '\0') {
        if ((lVar16 < lVar30) &&
           (piVar2 = (int *)(lVar24 + 0xc + lVar34 * 4), *piVar2 = *piVar2 + 1,
           *(char *)(lVar34 + 3 + lVar26) != '\0')) {
          if ((iVar33 < 2) ||
             (piVar2 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + lVar12 + 8 +
                              lVar34 * 4), *piVar2 = *piVar2 + 1,
             *(char *)(lVar34 + 2 + img.img_._16_8_ + *(long *)img.img_._72_8_ + lVar31) == '\0')) {
LAB_001babe5:
            local_338 = UFPC::MemNewLabel();
            piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar12 + 8 + lVar34 * 4);
            *piVar2 = *piVar2 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar12 + 8 + lVar34 * 4) = local_338;
          }
          else {
            piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar12 + 8 + lVar34 * 4);
            *piVar2 = *piVar2 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar12 + 8 + lVar34 * 4) = local_338;
          }
          bVar35 = true;
          goto LAB_001bac13;
        }
        if (1 < iVar33) {
          lVar19 = *(long *)img.accesses_._72_8_;
          piVar2 = (int *)(lVar24 + lVar19 + 8 + lVar34 * 4);
          *piVar2 = *piVar2 + 1;
          lVar24 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar34 + 2 + lVar26 + lVar24) == '\0') {
            if ((lVar16 < lVar30) &&
               (piVar2 = (int *)(img.accesses_._16_8_ + lVar19 + lVar12 + 0xc + lVar34 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar34 + 3 + img.img_._16_8_ + lVar24 + lVar31) != '\0'))
            goto LAB_001babe5;
          }
          else {
            piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar12 + 8 + lVar34 * 4);
            *piVar2 = *piVar2 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar12 + 8 + lVar34 * 4) = local_338;
            if (lVar16 < lVar30) {
              piVar2 = (int *)(img.accesses_._16_8_ + lVar19 + lVar12 + 0xc + lVar34 * 4);
              *piVar2 = *piVar2 + 1;
              goto LAB_001babbd;
            }
          }
        }
LAB_001bac11:
        bVar35 = false;
      }
      else {
        piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar12 + 8 + lVar34 * 4);
        *piVar2 = *piVar2 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar12 + 8 + lVar34 * 4) = local_338;
        if (lVar30 <= lVar16) goto LAB_001bac11;
        piVar2 = (int *)(lVar24 + 0xc + lVar34 * 4);
        *piVar2 = *piVar2 + 1;
        bVar35 = true;
        if (*(char *)(lVar34 + 3 + lVar26) == '\0') {
          if (1 < iVar33) {
            piVar2 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + lVar12 + 0xc +
                            lVar34 * 4);
            *piVar2 = *piVar2 + 1;
            lVar24 = *(long *)img.img_._72_8_;
LAB_001babbd:
            bVar35 = true;
            if (*(char *)(lVar34 + 3 + img.img_._16_8_ + lVar24 + lVar31) != '\0')
            goto LAB_001bac13;
          }
          goto LAB_001bac11;
        }
      }
LAB_001bac13:
    }
    iVar20 = iVar20 + (int)lVar34 + 2;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

        int lx, u, v, k;

#define CONDITION_B1 img(y, x) > 0 
#define CONDITION_B2 x+1<w && img(y, x+1) > 0                // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img(y + 1, x) > 0              // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img(y + 1, x + 1) > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img(y - 1, x - 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U2 img(y - 1, x) > 0
#define CONDITION_U3 x+1<w && img(y - 1, x + 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img(y - 1, x + 2) > 0          // WRONG in the original code -> add missing condition
#define ASSIGN_S  img_labels(y, x) = img_labels(y, x - 2)
#define ASSIGN_P  img_labels(y, x) = img_labels(y - 2, x - 2)
#define ASSIGN_Q  img_labels(y, x) = img_labels(y - 2, x)
#define ASSIGN_R  img_labels(y, x) = img_labels(y - 2, x + 2)
#define ASSIGN_LX img_labels(y, x) = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels(y - 2, x-2)
#define LOAD_PV v = img_labels(y - 2, x-2)
#define LOAD_QU u = img_labels(y - 2, x)
#define LOAD_QV v = img_labels(y - 2, x)
#define LOAD_QK k = img_labels(y - 2, x)
#define LOAD_RV v = img_labels(y - 2, x+2)
#define LOAD_RK k = img_labels(y - 2, x+2)
#define NEW_LABEL lx = img_labels(y, x) = LabelsSolver::MemNewLabel();
#define RESOLVE_2(u, v) LabelsSolver::MemMerge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::MemMerge(u,LabelsSolver::MemMerge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }